

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O3

void __thiscall helics::CommonCore::processDisconnect(CommonCore *this)

{
  bool in_SIL;
  
  processDisconnect((CommonCore *)&this[-1].initIterations,in_SIL);
  return;
}

Assistant:

void CommonCore::processDisconnect(bool skipUnregister)
{
    auto cBrokerState = getBrokerState();
    if (cBrokerState > BrokerState::CONFIGURED) {
        if (cBrokerState < BrokerState::TERMINATING) {
            setBrokerState(BrokerState::TERMINATING);
            sendDisconnect();
            if ((global_broker_id_local != parent_broker_id) &&
                (global_broker_id_local.isValid())) {
                ActionMessage dis(CMD_DISCONNECT);
                dis.source_id = global_broker_id_local;
                transmit(parent_route_id, dis);
            } else {
                ActionMessage dis(CMD_DISCONNECT_NAME);
                dis.payload = getIdentifier();
                transmit(parent_route_id, dis);
            }
            addActionMessage(CMD_STOP);
            return;
        }
        brokerDisconnect();
    }
    setBrokerState(BrokerState::TERMINATED);
    if (!skipUnregister) {
        unregister();
    }
    disconnection.trigger();
}